

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O1

bool __thiscall Hpipe::Cond::always_checked(Cond *this,Cond *not_in)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  if (not_in == (Cond *)0x0) {
    if ((this->p).super__Base_bitset<4UL>._M_w[0] == 0xffffffffffffffff) {
      uVar2 = 0;
      do {
        uVar1 = uVar2;
        if (uVar1 == 2) {
          uVar1 = 2;
          break;
        }
        uVar2 = uVar1 + 1;
      } while ((this->p).super__Base_bitset<4UL>._M_w[uVar1 + 1] == 0xffffffffffffffff);
      bVar3 = 1 < uVar1;
    }
    else {
      bVar3 = false;
    }
    bVar3 = (bool)((this->p).super__Base_bitset<4UL>._M_w[3] == 0xffffffffffffffff & bVar3);
  }
  else {
    uVar2 = 0;
    bVar3 = false;
    do {
      if ((((not_in->p).super__Base_bitset<4UL>._M_w[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) == 0) &&
         (((this->p).super__Base_bitset<4UL>._M_w[uVar2 >> 6] & 1L << ((byte)uVar2 & 0x3f)) == 0)) {
        return bVar3;
      }
      bVar3 = 0xfe < uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar2 != 0x100);
  }
  return bVar3;
}

Assistant:

bool Cond::always_checked( const Cond *not_in ) const {
    if ( not_in ) {
        for( int i = 0; i < p_size; ++i )
            if ( not not_in->p[ i ] and not p[ i ] )
                return false;
        return true;
    }
    return p.all();
}